

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-circular-array.cc
# Opt level: O3

void __thiscall CircularArrayTest_empty_Test::TestBody(CircularArrayTest_empty_Test *this)

{
  bool bVar1;
  int line;
  char *in_R9;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  CircularArray<(anonymous_namespace)::TestObject,_2UL> ca;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  AssertHelper local_80;
  internal local_78 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  string local_68;
  CircularArray<(anonymous_namespace)::TestObject,_2UL> local_48;
  
  local_48.contents_._M_elems[0].data = 0;
  local_48.contents_._M_elems[0].data2 = 0;
  local_48.contents_._M_elems[0].moved = false;
  local_48.contents_._M_elems[1].data = 0;
  local_48.contents_._M_elems[1].data2 = 0;
  local_48.contents_._M_elems[1].moved = false;
  (anonymous_namespace)::TestObject::construct_count =
       (anonymous_namespace)::TestObject::construct_count + 2;
  local_48.size_ = 0;
  local_48.front_ = 0;
  local_68._M_dataplus._M_p._0_1_ = 1;
  local_68._M_string_length = 0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_68._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_68._M_dataplus._M_p = (char *)0x1;
  local_68._M_string_length = local_68._M_string_length & 0xffffffffffffff00;
  (anonymous_namespace)::TestObject::construct_count =
       (anonymous_namespace)::TestObject::construct_count + 1;
  wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::push_back
            (&local_48,(value_type *)&local_68);
  (anonymous_namespace)::TestObject::destruct_count =
       (anonymous_namespace)::TestObject::destruct_count + 1;
  local_78[0] = (internal)(local_48.size_ != 0);
  local_70.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_48.size_ == 0) {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,local_78,(AssertionResult *)"ca.empty()","true","false",in_R9);
    line = 0xb6;
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_68._M_dataplus._M_p = (char *)0x2;
    local_68._M_string_length = local_68._M_string_length & 0xffffffffffffff00;
    (anonymous_namespace)::TestObject::construct_count =
         (anonymous_namespace)::TestObject::construct_count + 1;
    wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::push_back
              (&local_48,(value_type *)&local_68);
    (anonymous_namespace)::TestObject::destruct_count =
         (anonymous_namespace)::TestObject::destruct_count + 1;
    local_78[0] = (internal)(local_48.size_ != 0);
    local_70.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_48.size_ == 0) {
      testing::Message::Message((Message *)&local_88);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_68,local_78,(AssertionResult *)"ca.empty()","true","false",in_R9);
      line = 0xb9;
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::pop_back(&local_48);
      local_78[0] = (internal)(local_48.size_ != 0);
      local_70.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_48.size_ == 0) {
        testing::Message::Message((Message *)&local_88);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_68,local_78,(AssertionResult *)"ca.empty()","true","false",in_R9);
        line = 0xbc;
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::pop_back(&local_48);
        local_78[0] = (internal)(local_48.size_ == 0);
        local_70.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((bool)local_78[0]) goto LAB_001d534f;
        testing::Message::Message((Message *)&local_88);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_68,local_78,(AssertionResult *)"ca.empty()","false","true",in_R9);
        line = 0xbf;
      }
    }
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_80,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-circular-array.cc"
             ,line,local_68._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_88);
  testing::internal::AssertHelper::~AssertHelper(&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (local_88.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_88.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_88.ptr_ + 8))();
    }
  }
LAB_001d534f:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::~CircularArray(&local_48);
  return;
}

Assistant:

TEST_F(CircularArrayTest, empty) {
  CircularArray<TestObject, 2> ca;

  ASSERT_TRUE(ca.empty());

  ca.push_back(TestObject(1));
  ASSERT_FALSE(ca.empty());

  ca.push_back(TestObject(2));
  ASSERT_FALSE(ca.empty());

  ca.pop_back();
  ASSERT_FALSE(ca.empty());

  ca.pop_back();
  ASSERT_TRUE(ca.empty());
}